

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O1

cse_abstract * __thiscall
factory_item<xray_re::se_smart_cover>::create(factory_item<xray_re::se_smart_cover> *this)

{
  cse_smart_cover *this_00;
  
  this_00 = (cse_smart_cover *)operator_new(0x198);
  xray_re::cse_smart_cover::cse_smart_cover(this_00);
  (this_00->super_cse_shape)._vptr_cse_shape = (_func_int **)&PTR__se_smart_cover_0024cef0;
  (this_00->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.
  _vptr_cse_abstract = (_func_int **)&PTR__se_smart_cover_0024cf38;
  this_00[1].super_cse_shape._vptr_cse_shape =
       (_func_int **)
       &this_00[1].super_cse_shape.m_shapes.
        super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
        super__Vector_impl_data._M_finish;
  this_00[1].super_cse_shape.m_shapes.
  super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined1 *)
   &this_00[1].super_cse_shape.m_shapes.
    super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  (this_00->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.m_clsid.
  field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)&this_00->super_cse_alife_dynamic_object;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}